

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<mp::expr::Kind>::Matcher(Matcher<mp::expr::Kind> *this,Kind value)

{
  Kind local_2c;
  MatcherBase<mp::expr::Kind> local_28;
  
  (this->super_MatcherBase<mp::expr::Kind>).impl_.value_ = (MatcherInterface<mp::expr::Kind> *)0x0;
  (this->super_MatcherBase<mp::expr::Kind>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::expr::Kind>).impl_.link_;
  (this->super_MatcherBase<mp::expr::Kind>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002b2b98;
  local_2c = value;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<mp::expr::Kind> *)&local_28,(EqMatcher *)&local_2c);
  internal::linked_ptr<const_testing::MatcherInterface<mp::expr::Kind>_>::operator=
            (&(this->super_MatcherBase<mp::expr::Kind>).impl_,&local_28.impl_);
  internal::MatcherBase<mp::expr::Kind>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }